

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O1

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> * __thiscall
hdc::Graph<int>::coloring
          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *__return_storage_ptr__,Graph<int> *this,int n_colors)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Elt_pointer psVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_color *p_Var9;
  ostream *poVar10;
  long *plVar11;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar12;
  int node;
  set<int,_std::less<int>,_std::allocator<int>_> availableColors;
  stack<int,_std::deque<int,_std::allocator<int>_>_> st;
  stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  st_edges;
  set<int,_std::less<int>,_std::allocator<int>_> colorsPool;
  Graph<int> aux;
  set<int,_std::less<int>,_std::allocator<int>_> removed;
  int local_240;
  _Rb_tree_color local_234;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_230;
  _Base_ptr local_200;
  _Deque_base<int,_std::allocator<int>_> local_1f8;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_1a0;
  string local_198;
  _Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  local_178;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_120;
  Graph<int> local_f0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_200 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = local_200;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = local_200;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              *)&local_f0,
             (_Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              *)this);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_f0.deleted._M_t,&(this->deleted)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::_Rb_tree(&local_f0.assignedColors._M_t,&(this->assignedColors)._M_t);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_1f8,0);
  local_178._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::_M_initialize_map(&local_178,0);
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_230._M_impl._0_4_ = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < n_colors) {
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_120,(int *)&local_230);
      local_230._M_impl._0_4_ = local_230._M_impl._0_4_ + _S_black;
    } while ((int)local_230._M_impl._0_4_ < n_colors);
  }
  p_Var1 = &local_f0.graph._M_t._M_impl.super__Rb_tree_header;
  local_1a0 = &this->assignedColors;
  while (p_Var4 = local_f0.graph._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
        (_Rb_tree_header *)local_f0.graph._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        p_Var1) {
    while( true ) {
      local_230._M_impl._0_4_ = p_Var4[1]._M_color;
      pmVar3 = std::
               map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](&local_f0.graph,(key_type *)&local_230);
      if ((int)(pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count < n_colors) break;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      if ((_Rb_tree_header *)p_Var4 == p_Var1) goto LAB_0017338c;
    }
    to_str_abi_cxx11_((string *)&local_230,&local_f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               (char *)CONCAT44(local_230._M_impl._4_4_,local_230._M_impl._0_4_),
               local_230._M_impl.super__Rb_tree_header._M_header._0_8_);
    if ((_Base_ptr *)CONCAT44(local_230._M_impl._4_4_,local_230._M_impl._0_4_) !=
        &local_230._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((undefined1 *)CONCAT44(local_230._M_impl._4_4_,local_230._M_impl._0_4_));
    }
    p_Var8 = p_Var4 + 1;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_60
               ,(int *)p_Var8);
    if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)&local_1f8,(int *)p_Var8);
    }
    else {
      *local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = p_Var8->_M_color;
      local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    std::
    deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::push_back((deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 *)&local_178,(value_type *)&p_Var4[1]._M_parent);
    removeNode(&local_f0,p_Var8->_M_color);
  }
LAB_0017338c:
  if (local_f0.graph._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator<<((ostream *)&std::cout,"Graph coloring: couldn\'t colore graph\nExiting...\n");
    exit(0);
  }
  to_str_abi_cxx11_((string *)&local_230,&local_f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)CONCAT44(local_230._M_impl._4_4_,local_230._M_impl._0_4_)
             ,local_230._M_impl.super__Rb_tree_header._M_header._0_8_);
  if ((_Base_ptr *)CONCAT44(local_230._M_impl._4_4_,local_230._M_impl._0_4_) !=
      &local_230._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((undefined1 *)CONCAT44(local_230._M_impl._4_4_,local_230._M_impl._0_4_));
  }
  local_240 = -1;
  while (((long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_last -
          (long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2) +
         ((long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur -
          (long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
         ((((ulong)((long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node -
                   (long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
         (ulong)(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
         0x80 != 0) {
    p_Var9 = (_Rb_tree_color *)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
      p_Var9 = (_Rb_tree_color *)
               (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80);
    }
    local_234 = p_Var9[-1];
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_230,&local_120);
    insertNode(&local_f0,local_234);
    psVar5 = local_178._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_178._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_178._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar5 = local_178._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
    }
    p_Var8 = psVar5[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      psVar5 = local_178._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_178._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_178._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar5 = local_178._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      if ((_Rb_tree_header *)p_Var8 == &psVar5[-1]._M_t._M_impl.super__Rb_tree_header) break;
      makeEdge(&local_f0,local_234,p_Var8[1]._M_color);
      sVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                        (__return_storage_ptr__,(key_type *)(p_Var8 + 1));
      if (sVar6 != 0) {
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](__return_storage_ptr__,(key_type *)(p_Var8 + 1));
        pVar12 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                 ::equal_range(&local_230,pmVar7);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_erase_aux(&local_230,(_Base_ptr)pVar12.first._M_node,(_Base_ptr)pVar12.second._M_node);
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    }
    _Var2 = ((_Base_ptr)((long)local_230._M_impl.super__Rb_tree_header._M_header._M_left + 0x20))->
            _M_color;
    p_Var9 = (_Rb_tree_color *)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](__return_storage_ptr__,(key_type *)&local_234);
    *p_Var9 = _Var2;
    pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](__return_storage_ptr__,(key_type *)&local_234);
    if (local_240 < *pmVar7) {
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](__return_storage_ptr__,(key_type *)&local_234);
      local_240 = *pmVar7;
    }
    to_str_abi_cxx11_(&local_198,&local_f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_198._M_dataplus._M_p,local_198._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
      operator_delete(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first);
      local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first =
           local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last =
           (_Elt_pointer)
           ((_Rb_tree_color *)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80);
      local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           (_Elt_pointer)
           ((_Rb_tree_color *)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f);
      local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
           local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
    }
    else {
      local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
    }
    std::
    deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::pop_back((deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)&local_178);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_230);
  }
  p_Var4 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var4 != local_200) {
    do {
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_Var4[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,*(int *)&p_Var4[1].field_0x4);
      local_230._M_impl._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_230,1);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_200);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&local_1a0->_M_t,&__return_storage_ptr__->_M_t);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#colors = ",10);
  plVar11 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_240 + 1);
  std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
  std::ostream::put((char)plVar11);
  std::ostream::flush();
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_120);
  std::
  deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::~deque((deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            *)&local_178);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_1f8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_f0.assignedColors._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_f0.deleted._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::map<T, int> coloring(int n_colors) {
            std::map<T, int> r;
            Graph<T> aux = *this;
            std::set<T> removed;
            std::stack<T> st;
            std::stack<std::set<T> > st_edges;
            bool foundVertex = true;
            std::set<int> colorsPool;
            int max_color = -1;

            typename std::map<T, std::set<T> >::iterator it1;

            for (int i = 0; i < n_colors; ++i) {
                colorsPool.insert(i);
            }

            while (foundVertex) {
                foundVertex = false;

                for (it1 = aux.graph.begin(); it1 != aux.graph.end(); ++it1) {
                    if (aux.countEdges(it1->first) < n_colors) {
                        std::cout << aux.to_str();

                        removed.insert(it1->first);
                        st.push(it1->first);
                        st_edges.push(it1->second);
                        foundVertex = true;
                        aux.removeNode(it1->first);
                        break;
                    }
                }
            }

            if (aux.graph.size() != 0) {
                std::cout << "Graph coloring: couldn't colore graph\nExiting...\n";
                exit(0);
            }

            std::cout << aux.to_str();

            while (st.size() > 0) {
                T node = st.top();
                std::set<int> availableColors = colorsPool;
                typename std::set<T>::iterator it;

                aux.insertNode(node);

                for (it = st_edges.top().begin(); it != st_edges.top().end(); ++it) {
                    aux.makeEdge(node, *it);

                    if (r.count(*it) > 0) {
                        availableColors.erase(r[*it]);
                    }
                }

                r[node] = *availableColors.begin();

                if (r[node] > max_color) {
                    max_color = r[node];
                }

                std::cout << aux.to_str();
                st.pop();
                st_edges.pop();
            }

            typename std::map<T, int>::iterator j;

            for (j = r.begin(); j != r.end(); ++j) {
                std::cout << j->first << ": " << j->second << '\n';
            }

            assignedColors = r;
            std::cout << "#colors = " << (max_color + 1) << std::endl;
            return r;
        }